

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bson.c
# Opt level: O0

void test_bson_alloc(void)

{
  int iVar1;
  uint *puVar2;
  void *__s1;
  bson_t *b;
  
  puVar2 = (uint *)bson_new();
  if (puVar2[1] != 5) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: (line#%d)b->len == 5\n",0x52);
    abort();
  }
  if ((*puVar2 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x53,"test_bson_alloc","(b->flags & BSON_FLAG_INLINE)");
    abort();
  }
  if ((*puVar2 & 8) != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x54,"test_bson_alloc","!(b->flags & BSON_FLAG_CHILD)");
    abort();
  }
  if ((*puVar2 & 2) != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x55,"test_bson_alloc","!(b->flags & BSON_FLAG_STATIC)");
    abort();
  }
  if ((*puVar2 & 0x20) != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x56,"test_bson_alloc","!(b->flags & BSON_FLAG_NO_FREE)");
    abort();
  }
  bson_destroy(puVar2);
  puVar2 = (uint *)bson_sized_new(0x2c);
  if (puVar2[1] != 5) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: (line#%d)b->len == 5\n",0x5d);
    abort();
  }
  if ((*puVar2 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x5e,"test_bson_alloc","(b->flags & BSON_FLAG_INLINE)");
    abort();
  }
  bson_destroy(puVar2);
  puVar2 = (uint *)bson_sized_new(0x79);
  if (puVar2[1] != 5) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: (line#%d)b->len == 5\n",0x65);
    abort();
  }
  if ((*puVar2 & 1) != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x66,"test_bson_alloc","!(b->flags & BSON_FLAG_INLINE)");
    abort();
  }
  bson_destroy(puVar2);
  puVar2 = (uint *)bson_sized_new(0x81);
  if (puVar2[1] != 5) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: (line#%d)b->len == 5\n",0x6d);
    abort();
  }
  if ((*puVar2 & 1) != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x6e,"test_bson_alloc","!(b->flags & BSON_FLAG_INLINE)");
    abort();
  }
  bson_destroy(puVar2);
  puVar2 = (uint *)bson_new_from_data("\x05",5);
  if (puVar2[1] != 5) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: (line#%d)b->len == sizeof empty_bson\n",0x72);
    abort();
  }
  if ((*puVar2 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x73,"test_bson_alloc","(b->flags & BSON_FLAG_INLINE)");
    abort();
  }
  __s1 = (void *)bson_get_data(puVar2);
  iVar1 = memcmp(__s1,"\x05",5);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x74,"test_bson_alloc","!memcmp (bson_get_data (b), empty_bson, sizeof empty_bson)");
    abort();
  }
  bson_destroy(puVar2);
  return;
}

Assistant:

static void
test_bson_alloc (void)
{
   static const uint8_t empty_bson[] = {5, 0, 0, 0, 0};
   bson_t *b;

   b = bson_new ();
   BSON_ASSERT_CMPINT (b->len, ==, 5);
   BSON_ASSERT ((b->flags & BSON_FLAG_INLINE));
   BSON_ASSERT (!(b->flags & BSON_FLAG_CHILD));
   BSON_ASSERT (!(b->flags & BSON_FLAG_STATIC));
   BSON_ASSERT (!(b->flags & BSON_FLAG_NO_FREE));
   bson_destroy (b);

   /*
    * This checks that we fit in the inline buffer size.
    */
   b = bson_sized_new (44);
   BSON_ASSERT_CMPINT (b->len, ==, 5);
   BSON_ASSERT ((b->flags & BSON_FLAG_INLINE));
   bson_destroy (b);

   /*
    * Make sure we grow to next power of 2.
    */
   b = bson_sized_new (121);
   BSON_ASSERT_CMPINT (b->len, ==, 5);
   BSON_ASSERT (!(b->flags & BSON_FLAG_INLINE));
   bson_destroy (b);

   /*
    * Make sure we grow to next power of 2.
    */
   b = bson_sized_new (129);
   BSON_ASSERT_CMPINT (b->len, ==, 5);
   BSON_ASSERT (!(b->flags & BSON_FLAG_INLINE));
   bson_destroy (b);

   b = bson_new_from_data (empty_bson, sizeof empty_bson);
   BSON_ASSERT_CMPINT (b->len, ==, sizeof empty_bson);
   BSON_ASSERT ((b->flags & BSON_FLAG_INLINE));
   BSON_ASSERT (!memcmp (bson_get_data (b), empty_bson, sizeof empty_bson));
   bson_destroy (b);
}